

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseTagModuleField(WastParser *this,Module *module)

{
  ModuleField *pMVar1;
  _func_int ***ppp_Var2;
  bool bVar3;
  Result RVar4;
  TagImport *this_00;
  Enum EVar5;
  long *plVar6;
  long lVar7;
  string_view name_00;
  string name;
  ModuleFieldList export_fields;
  Location loc;
  string local_128;
  _Head_base<0UL,_wabt::TagModuleField_*,_false> local_108;
  __uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_100;
  undefined1 *local_f8;
  long lStack_f0;
  long local_e8;
  long lStack_e0;
  ModuleFieldList local_d8;
  undefined8 local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  int local_a8;
  int iStack_a4;
  int iStack_a0;
  undefined4 uStack_9c;
  undefined1 local_90 [32];
  undefined1 *local_70;
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  if (*this->options_ == (WastParseOptions)0x0) {
    Consume((Token *)local_90,this);
    Error(this,0x1eda8e);
    return (Result)Error;
  }
  RVar4 = Expect(this,Lpar);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  RVar4 = Expect(this,Tag);
  if (RVar4.enum_ == Error) {
    return (Result)Error;
  }
  GetToken((Token *)local_90,this);
  uStack_b0 = local_90._8_4_;
  uStack_ac = local_90._12_4_;
  local_a8 = local_90._16_4_;
  iStack_a4 = local_90._20_4_;
  iStack_a0 = local_90._24_4_;
  uStack_9c = local_90._28_4_;
  local_b8 = (undefined1 *)local_90._0_8_;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  local_128._M_string_length = 0;
  local_128.field_2._M_local_buf[0] = '\0';
  ParseBindVarOpt(this,&local_128);
  local_d8.size_ = 0;
  local_d8.first_ = (ModuleField *)0x0;
  local_d8.last_ = (ModuleField *)0x0;
  RVar4 = ParseInlineExports(this,&local_d8,Last);
  EVar5 = Error;
  if (RVar4.enum_ == Error) goto LAB_0018743f;
  bVar3 = PeekMatchLpar(this,Import);
  if (bVar3) {
    CheckImportOrdering(this,module);
    this_00 = (TagImport *)operator_new(0xf0);
    name_00._M_str = local_128._M_dataplus._M_p;
    name_00._M_len = local_128._M_string_length;
    TagImport::TagImport(this_00,name_00);
    RVar4 = ParseInlineImport(this,(Import *)this_00);
    if (((RVar4.enum_ != Error) &&
        (RVar4 = ParseTypeUseOpt(this,&(this_00->tag).decl), RVar4.enum_ != Error)) &&
       (RVar4 = ParseUnboundFuncSignature(this,&(this_00->tag).decl.sig), RVar4.enum_ != Error)) {
      local_90._0_8_ = local_90 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"type","");
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"param","");
      plVar6 = local_40;
      local_50[0] = plVar6;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"result","");
      local_f8 = (undefined1 *)0x0;
      lStack_f0 = 0;
      local_e8 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
                 local_90,&stack0xffffffffffffffd0);
      RVar4 = ErrorIfLpar(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&local_f8,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f8);
      lVar7 = -0x60;
      do {
        if (plVar6 != (long *)plVar6[-2]) {
          operator_delete((long *)plVar6[-2],*plVar6 + 1);
        }
        plVar6 = plVar6 + -4;
        lVar7 = lVar7 + 0x20;
      } while (lVar7 != 0);
      if (RVar4.enum_ != Error) {
        GetToken((Token *)local_90,this);
        lStack_f0 = CONCAT44(local_90._12_4_,local_90._8_4_);
        local_e8 = CONCAT44(local_90._20_4_,local_90._16_4_);
        lStack_e0 = CONCAT44(local_90._28_4_,local_90._24_4_);
        local_f8 = (undefined1 *)local_90._0_8_;
        local_100._M_t.
        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
             (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
             operator_new(0x48);
        *(long *)((long)local_100._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 8) =
             0;
        *(long *)((long)local_100._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x10
                 ) = 0;
        *(undefined ***)
         local_100._M_t.
         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
             &PTR__ModuleField_00242ba0;
        *(undefined1 **)
         ((long)local_100._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x18) =
             local_f8;
        *(long *)((long)local_100._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x20
                 ) = lStack_f0;
        *(long *)((long)local_100._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x28
                 ) = local_e8;
        *(long *)((long)local_100._M_t.
                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x30
                 ) = lStack_e0;
        *(undefined4 *)
         ((long)local_100._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x38) = 2;
        *(undefined ***)
         local_100._M_t.
         super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
         .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
             &PTR__ImportModuleField_00242d18;
        *(TagImport **)
         ((long)local_100._M_t.
                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl + 0x40) =
             this_00;
        Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                    *)&local_100);
        if ((_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
             )local_100._M_t.
              super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
              .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl !=
            (ImportModuleField *)0x0) {
          (**(code **)(*(long *)local_100._M_t.
                                super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                _M_head_impl + 8))();
        }
        local_100._M_t.
        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>._M_head_impl =
             (tuple<wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>)
             (_Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
              )0x0;
        goto LAB_001874aa;
      }
    }
  }
  else {
    this_00 = (TagImport *)operator_new(0xe0);
    (this_00->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.module_name._M_dataplus._M_p =
         (pointer)0x0;
    (this_00->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.module_name._M_string_length =
         0;
    (this_00->super_ImportMixin<(wabt::ExternalKind)4>).super_Import._vptr_Import =
         (_func_int **)&PTR__ModuleField_00242ba0;
    *(int *)&(this_00->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.field_name._M_dataplus
             ._M_p = local_a8;
    *(int *)((long)&(this_00->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.field_name.
                    _M_dataplus._M_p + 4) = iStack_a4;
    *(int *)&(this_00->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.field_name.
             _M_string_length = iStack_a0;
    *(undefined4 *)
     ((long)&(this_00->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.field_name.
             _M_string_length + 4) = uStack_9c;
    *(undefined4 *)
     &(this_00->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.module_name.field_2 =
         (undefined4)local_b8;
    *(undefined4 *)
     ((long)&(this_00->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.module_name.field_2 +
     4) = local_b8._4_4_;
    *(undefined4 *)
     ((long)&(this_00->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.module_name.field_2 +
     8) = uStack_b0;
    *(undefined4 *)
     ((long)&(this_00->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.module_name.field_2 +
     0xc) = uStack_ac;
    *(undefined4 *)
     &(this_00->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.field_name.field_2 = 10;
    (this_00->super_ImportMixin<(wabt::ExternalKind)4>).super_Import._vptr_Import =
         (_func_int **)&PTR__TagModuleField_002447c8;
    *(Tag **)((long)&(this_00->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.field_name.
                     field_2 + 8) = &this_00->tag;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)
               ((long)&(this_00->super_ImportMixin<(wabt::ExternalKind)4>).super_Import.field_name.
                       field_2 + 8),local_128._M_dataplus._M_p,
               local_128._M_dataplus._M_p + local_128._M_string_length);
    (this_00->tag).name.field_2._M_local_buf[0] = '\0';
    Var::Var((Var *)((long)&(this_00->tag).name.field_2 + 8));
    (this_00->tag).decl.sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (this_00->tag).decl.sig.result_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->tag).decl.sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this_00->tag).decl.sig.param_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)((long)&(this_00->tag).decl.type_var.field_2 + 0x10) = 0;
    *(undefined8 *)((long)&(this_00->tag).decl.type_var.field_2 + 0x18) = 0;
    RVar4 = ParseTypeUseOpt(this,(FuncDeclaration *)&(this_00->tag).name.field_2);
    if ((RVar4.enum_ != Error) &&
       (RVar4 = ParseUnboundFuncSignature
                          (this,(FuncSignature *)
                                ((long)&(this_00->tag).decl.type_var.field_2 + 0x10)),
       RVar4.enum_ != Error)) {
      local_108._M_head_impl = (TagModuleField *)this_00;
      Module::AppendField(module,(unique_ptr<wabt::TagModuleField,_std::default_delete<wabt::TagModuleField>_>
                                  *)&local_108);
      if ((TagImport *)local_108._M_head_impl != (TagImport *)0x0) {
        (*(((ImportMixin<(wabt::ExternalKind)4> *)
           &(local_108._M_head_impl)->super_ModuleFieldMixin<(wabt::ModuleFieldType)10>)->
          super_Import)._vptr_Import[1])();
      }
      local_108._M_head_impl = (TagModuleField *)0x0;
LAB_001874aa:
      anon_unknown_1::AppendInlineExportFields
                (module,&local_d8,
                 (int)((ulong)((long)(module->tags).
                                     super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)(module->tags).
                                    super__Vector_base<wabt::Tag_*,_std::allocator<wabt::Tag_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
      RVar4 = Expect(this,Rpar);
      EVar5 = (Enum)(RVar4.enum_ == Error);
      goto LAB_0018743f;
    }
  }
  (*(this_00->super_ImportMixin<(wabt::ExternalKind)4>).super_Import._vptr_Import[1])(this_00);
LAB_0018743f:
  pMVar1 = local_d8.first_;
  while (pMVar1 != (ModuleField *)0x0) {
    ppp_Var2 = &pMVar1->_vptr_ModuleField;
    pMVar1 = (pMVar1->super_intrusive_list_base<wabt::ModuleField>).next_;
    (*(*ppp_Var2)[1])();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,
                    CONCAT71(local_128.field_2._M_allocated_capacity._1_7_,
                             local_128.field_2._M_local_buf[0]) + 1);
  }
  return (Result)EVar5;
}

Assistant:

Result WastParser::ParseTagModuleField(Module* module) {
  WABT_TRACE(ParseTagModuleField);
  if (!options_->features.exceptions_enabled()) {
    Error(Consume().loc, "tag not allowed");
    return Result::Error;
  }
  EXPECT(Lpar);
  EXPECT(Tag);
  Location loc = GetLocation();

  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Tag));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = std::make_unique<TagImport>(name);
    Tag& tag = import->tag;
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseTypeUseOpt(&tag.decl));
    CHECK_RESULT(ParseUnboundFuncSignature(&tag.decl.sig));
    CHECK_RESULT(ErrorIfLpar({"type", "param", "result"}));
    auto field =
        std::make_unique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = std::make_unique<TagModuleField>(loc, name);
    CHECK_RESULT(ParseTypeUseOpt(&field->tag.decl));
    CHECK_RESULT(ParseUnboundFuncSignature(&field->tag.decl.sig));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->tags.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}